

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  __uid_t _Var2;
  int extraout_EAX;
  undefined8 uVar3;
  anon_union_8_2_26168aa3_for_data aVar4;
  __sighandler_t p_Var5;
  uv_process_options_t *puVar6;
  passwd *ppVar7;
  ssize_t sVar8;
  uv_buf_t *buf;
  uv_process_t *puVar9;
  uv_process_t *puVar10;
  code *nread;
  uv_timer_t *puVar11;
  uv_process_options_t *__s;
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_write_t write_req;
  undefined1 auStack_7f8 [16];
  uv_handle_type uStack_7e8;
  undefined4 uStack_7e0;
  undefined4 uStack_7d0;
  uv_stream_t uStack_7b8;
  anon_union_8_2_26168aa3_for_data aStack_6b0;
  int iStack_69c;
  uv_stdio_container_t uStack_698;
  undefined1 auStack_680 [16];
  undefined1 auStack_670 [264];
  undefined1 auStack_568 [440];
  undefined1 auStack_3b0 [192];
  anon_union_8_2_26168aa3_for_data aStack_2f0;
  uv_process_options_t *puStack_2e8;
  anon_union_8_2_26168aa3_for_data aStack_2e0;
  anon_union_8_2_26168aa3_for_data aStack_2d8;
  anon_union_8_2_26168aa3_for_data aStack_2d0;
  char acStack_2ba [10];
  anon_union_8_2_26168aa3_for_data aStack_2b0;
  sigset_t sStack_290;
  anon_union_8_2_26168aa3_for_data aStack_210;
  undefined1 local_208 [16];
  uv_stdio_container_t local_1f8 [2];
  undefined1 local_1d8 [264];
  undefined1 local_d0 [192];
  
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e1fd;
  init_process_options("spawn_helper3",exit_cb);
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e202;
  uVar3 = uv_default_loop();
  aVar4.stream = (uv_stream_t *)local_1d8;
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e214;
  uv_pipe_init(uVar3,aVar4.stream,0);
  options.stdio = local_1f8;
  __s = &options;
  local_1f8[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e242;
  local_1f8[0].data.stream = aVar4.stream;
  close(0);
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e247;
  uVar3 = uv_default_loop();
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e259;
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e272;
    local_208 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e29d;
    iVar1 = uv_write(local_d0,local_1d8,local_208,1,write_cb);
    if (iVar1 != 0) goto LAB_0016e30c;
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e2a6;
    uVar3 = uv_default_loop();
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e2b0;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e311;
    if (exit_cb_called != 1) goto LAB_0016e316;
    if (close_cb_called != 2) goto LAB_0016e31b;
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e2cb;
    aVar4.stream = (uv_stream_t *)uv_default_loop();
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e2df;
    uv_walk(aVar4.stream,close_walk_cb,0);
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e2e9;
    uv_run(aVar4.stream,0);
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e2ee;
    uVar3 = uv_default_loop();
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e2f6;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e30c;
    run_test_spawn_closed_process_io_cold_1();
LAB_0016e30c:
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e311;
    run_test_spawn_closed_process_io_cold_2();
LAB_0016e311:
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e316;
    run_test_spawn_closed_process_io_cold_3();
LAB_0016e316:
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e31b;
    run_test_spawn_closed_process_io_cold_4();
LAB_0016e31b:
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e320;
    run_test_spawn_closed_process_io_cold_5();
  }
  aStack_210.stream = (uv_stream_t *)run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  puVar6 = (uv_process_options_t *)&sStack_290;
  aStack_210 = aVar4;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_290);
  sigaddset(&sStack_290,0xf);
  iVar1 = pthread_sigmask(0,&sStack_290,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    p_Var5 = signal(0xf,(__sighandler_t)0x1);
    if (p_Var5 == (__sighandler_t)0xffffffffffffffff) goto LAB_0016e483;
    uVar3 = uv_default_loop();
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 != 0) goto LAB_0016e488;
    sigemptyset(&sStack_290);
    sigaddset(&sStack_290,0xf);
    iVar1 = pthread_sigmask(1,&sStack_290,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_0016e48d;
    p_Var5 = signal(0xf,(__sighandler_t)0x0);
    if (p_Var5 == (__sighandler_t)0xffffffffffffffff) goto LAB_0016e492;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_0016e497;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 != 0) goto LAB_0016e49c;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e4a1;
    if (exit_cb_called != 1) goto LAB_0016e4a6;
    if (close_cb_called != 1) goto LAB_0016e4ab;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar6,close_walk_cb,0);
    uv_run(puVar6,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_0016e483:
    run_test_kill_cold_11();
LAB_0016e488:
    run_test_kill_cold_2();
LAB_0016e48d:
    run_test_kill_cold_3();
LAB_0016e492:
    run_test_kill_cold_10();
LAB_0016e497:
    run_test_kill_cold_4();
LAB_0016e49c:
    run_test_kill_cold_5();
LAB_0016e4a1:
    run_test_kill_cold_6();
LAB_0016e4a6:
    run_test_kill_cold_7();
LAB_0016e4ab:
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e4c5;
  aStack_2b0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 != 0) {
LAB_0016e607:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e60c;
    run_test_spawn_setuid_setgid_cold_5();
    return 1;
  }
  aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e4e0;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e4ec;
  ppVar7 = getpwnam("nobody");
  if (ppVar7 == (passwd *)0x0) {
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e618;
    run_test_spawn_setuid_setgid_cold_7();
LAB_0016e618:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e61d;
    run_test_spawn_setuid_setgid_cold_6();
LAB_0016e61d:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e622;
    run_test_spawn_setuid_setgid_cold_1();
LAB_0016e622:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e627;
    run_test_spawn_setuid_setgid_cold_2();
LAB_0016e627:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e62c;
    run_test_spawn_setuid_setgid_cold_3();
  }
  else {
    options.uid = ppVar7->pw_uid;
    puVar6 = &options;
    options.gid = ppVar7->pw_gid;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e52f;
    snprintf(acStack_2ba,10,"%d");
    __s = (uv_process_options_t *)&stack0xfffffffffffffd3c;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e54a;
    snprintf((char *)__s,10,"%d",(ulong)ppVar7->pw_gid);
    options.args[2] = acStack_2ba;
    options.args[3] = (char *)__s;
    options.flags = 3;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e56f;
    uVar3 = uv_default_loop();
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e581;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 != 0) {
      if (iVar1 == -0xd) goto LAB_0016e607;
      goto LAB_0016e618;
    }
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e58a;
    uVar3 = uv_default_loop();
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e594;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0016e61d;
    if (exit_cb_called != 1) goto LAB_0016e622;
    if (close_cb_called != 1) goto LAB_0016e627;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e5b3;
    __s = (uv_process_options_t *)uv_default_loop();
    puVar6 = (uv_process_options_t *)0x0;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e5c9;
    uv_walk(__s,close_walk_cb,0);
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e5d3;
    uv_run(__s);
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e5d8;
    uVar3 = uv_default_loop();
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e5e0;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  aStack_2d0.stream = (uv_stream_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_4();
  aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e637;
  aStack_2d0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e647;
    aVar4.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar4.stream == (uv_stream_t *)0x0) goto LAB_0016e722;
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e65b;
    iVar1 = setgid(*(__gid_t *)&(aVar4.stream)->field_0x14);
    puVar6 = (uv_process_options_t *)aVar4.stream;
    if (iVar1 != 0) goto LAB_0016e727;
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e66b;
    iVar1 = setuid((aVar4.stream)->type);
    if (iVar1 == 0) goto LAB_0016e673;
  }
  else {
LAB_0016e673:
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e686;
    init_process_options("spawn_helper1",fail_cb);
    puVar6 = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e6a3;
    uVar3 = uv_default_loop();
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e6b5;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 == -1) {
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e6bf;
      uVar3 = uv_default_loop();
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e6c9;
      iVar1 = uv_run(uVar3);
      if (iVar1 != 0) goto LAB_0016e713;
      if (close_cb_called != 0) goto LAB_0016e718;
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e6db;
      puVar6 = (uv_process_options_t *)uv_default_loop();
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e6ef;
      uv_walk(puVar6,close_walk_cb,0);
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e6f9;
      uv_run(puVar6);
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e6fe;
      uVar3 = uv_default_loop();
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e706;
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e713;
      run_test_spawn_setuid_fails_cold_3();
LAB_0016e713:
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e718;
      run_test_spawn_setuid_fails_cold_4();
LAB_0016e718:
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e71d;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e722;
    run_test_spawn_setuid_fails_cold_6();
LAB_0016e722:
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e727;
    run_test_spawn_setuid_fails_cold_7();
LAB_0016e727:
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e72c;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_2d8.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e737;
  aStack_2d8 = (anon_union_8_2_26168aa3_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e747;
    aVar4.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar4.stream == (uv_stream_t *)0x0) goto LAB_0016e822;
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e75b;
    iVar1 = setgid(*(__gid_t *)&(aVar4.stream)->field_0x14);
    puVar6 = (uv_process_options_t *)aVar4.stream;
    if (iVar1 != 0) goto LAB_0016e827;
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e76b;
    iVar1 = setuid((aVar4.stream)->type);
    if (iVar1 == 0) goto LAB_0016e773;
  }
  else {
LAB_0016e773:
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e786;
    init_process_options("spawn_helper1",fail_cb);
    puVar6 = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e7a3;
    uVar3 = uv_default_loop();
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e7b5;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 == -1) {
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e7bf;
      uVar3 = uv_default_loop();
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e7c9;
      iVar1 = uv_run(uVar3);
      if (iVar1 != 0) goto LAB_0016e813;
      if (close_cb_called != 0) goto LAB_0016e818;
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e7db;
      puVar6 = (uv_process_options_t *)uv_default_loop();
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e7ef;
      uv_walk(puVar6,close_walk_cb,0);
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e7f9;
      uv_run(puVar6);
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e7fe;
      uVar3 = uv_default_loop();
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e806;
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e813;
      run_test_spawn_setgid_fails_cold_3();
LAB_0016e813:
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e818;
      run_test_spawn_setgid_fails_cold_4();
LAB_0016e818:
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e81d;
      run_test_spawn_setgid_fails_cold_5();
    }
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e822;
    run_test_spawn_setgid_fails_cold_6();
LAB_0016e822:
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e827;
    run_test_spawn_setgid_fails_cold_7();
LAB_0016e827:
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e82c;
    run_test_spawn_setgid_fails_cold_1();
  }
  aStack_2e0.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_setgid_fails_cold_2();
  puStack_2e8 = (uv_process_options_t *)0x16e840;
  aStack_2e0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_2e8 = (uv_process_options_t *)0x16e845;
  uVar3 = uv_default_loop();
  puStack_2e8 = (uv_process_options_t *)0x16e85b;
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    puStack_2e8 = (uv_process_options_t *)0x16e868;
    uVar3 = uv_default_loop();
    puStack_2e8 = (uv_process_options_t *)0x16e872;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e8f5;
    puStack_2e8 = (uv_process_options_t *)0x16e882;
    iVar1 = uv_is_closing(&process);
    if (iVar1 != 0) goto LAB_0016e8fa;
    puStack_2e8 = (uv_process_options_t *)0x16e894;
    uv_close(&process,0);
    puStack_2e8 = (uv_process_options_t *)0x16e899;
    uVar3 = uv_default_loop();
    puStack_2e8 = (uv_process_options_t *)0x16e8a3;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e8ff;
    puStack_2e8 = (uv_process_options_t *)0x16e8b3;
    iVar1 = uv_is_closing(&process);
    if (iVar1 != 1) goto LAB_0016e904;
    puStack_2e8 = (uv_process_options_t *)0x16e8bd;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_2e8 = (uv_process_options_t *)0x16e8d1;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_2e8 = (uv_process_options_t *)0x16e8db;
    uv_run(puVar6,0);
    puStack_2e8 = (uv_process_options_t *)0x16e8e0;
    uVar3 = uv_default_loop();
    puStack_2e8 = (uv_process_options_t *)0x16e8e8;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_2e8 = (uv_process_options_t *)0x16e8f5;
    run_test_spawn_auto_unref_cold_1();
LAB_0016e8f5:
    puStack_2e8 = (uv_process_options_t *)0x16e8fa;
    run_test_spawn_auto_unref_cold_2();
LAB_0016e8fa:
    puStack_2e8 = (uv_process_options_t *)0x16e8ff;
    run_test_spawn_auto_unref_cold_3();
LAB_0016e8ff:
    puStack_2e8 = (uv_process_options_t *)0x16e904;
    run_test_spawn_auto_unref_cold_4();
LAB_0016e904:
    puStack_2e8 = (uv_process_options_t *)0x16e909;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_2e8 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  nread = (code *)auStack_568;
  aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e939;
  aStack_2f0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  puStack_2e8 = __s;
  iStack_69c = uv_fs_open(0,nread,"/dev/null",2,0,0);
  if (iStack_69c < 0) {
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea96;
    run_test_spawn_fs_open_cold_1();
LAB_0016ea96:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea9b;
    run_test_spawn_fs_open_cold_2();
LAB_0016ea9b:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16eaa0;
    run_test_spawn_fs_open_cold_3();
LAB_0016eaa0:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16eaa5;
    run_test_spawn_fs_open_cold_4();
LAB_0016eaa5:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16eaaa;
    run_test_spawn_fs_open_cold_5();
LAB_0016eaaa:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16eaaf;
    run_test_spawn_fs_open_cold_6();
LAB_0016eaaf:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16eab4;
    run_test_spawn_fs_open_cold_7();
LAB_0016eab4:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16eab9;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e952;
    uv_fs_req_cleanup(auStack_568);
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e965;
    init_process_options("spawn_helper8",exit_cb);
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e96a;
    uVar3 = uv_default_loop();
    puVar6 = (uv_process_options_t *)auStack_670;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e97c;
    nread = (code *)puVar6;
    iVar1 = uv_pipe_init(uVar3,puVar6,0);
    if (iVar1 != 0) goto LAB_0016ea96;
    options.stdio = &uStack_698;
    uStack_698.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e9b0;
    uStack_698.data.stream = (uv_stream_t *)puVar6;
    uVar3 = uv_default_loop();
    puVar9 = &process;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e9c2;
    iVar1 = uv_spawn(uVar3,&process,&options);
    nread = (code *)puVar9;
    if (iVar1 != 0) goto LAB_0016ea9b;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e9d9;
    auStack_680 = uv_buf_init(&iStack_69c,4);
    nread = (code *)auStack_670;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea06;
    iVar1 = uv_write(auStack_3b0,nread,auStack_680,1,write_cb);
    if (iVar1 != 0) goto LAB_0016eaa0;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea13;
    uVar3 = uv_default_loop();
    nread = (code *)0x0;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea1d;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0016eaa5;
    nread = (code *)auStack_568;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea3a;
    iVar1 = uv_fs_close(0,nread,iStack_69c,0);
    if (iVar1 != 0) goto LAB_0016eaaa;
    if (exit_cb_called != 1) goto LAB_0016eaaf;
    if (close_cb_called != 2) goto LAB_0016eab4;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea55;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea69;
    uv_walk(puVar6,close_walk_cb,0);
    nread = (code *)0x0;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea73;
    uv_run(puVar6);
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea78;
    uVar3 = uv_default_loop();
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16ea80;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  aStack_6b0.stream = (uv_stream_t *)run_test_closed_fd_events;
  run_test_spawn_fs_open_cold_9();
  puVar9 = (uv_process_t *)auStack_7f8;
  aStack_6b0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  iVar1 = pipe((int *)puVar9);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = (uv_stdio_container_t *)(auStack_7f8 + 8);
    auStack_7f8._8_4_ = 2;
    uStack_7e8 = auStack_7f8._0_4_;
    uStack_7e0 = 0;
    uStack_7d0 = 0;
    puVar9 = (uv_process_t *)uv_default_loop();
    puVar10 = &process;
    iVar1 = uv_spawn(puVar9,&process,&options);
    nread = (code *)puVar10;
    if (iVar1 != 0) goto LAB_0016ed02;
    uv_unref(&process);
    puVar9 = (uv_process_t *)uv_default_loop();
    nread = (code *)&uStack_7b8;
    iVar1 = uv_pipe_init(puVar9,nread,0);
    if (iVar1 != 0) goto LAB_0016ed07;
    nread._4_4_ = 0;
    nread._0_4_ = auStack_7f8._0_4_;
    puVar9 = (uv_process_t *)&uStack_7b8;
    iVar1 = uv_pipe_open();
    if (iVar1 != 0) goto LAB_0016ed0c;
    auStack_7f8._0_4_ = ~UV_UNKNOWN_HANDLE;
    nread = on_alloc;
    puVar9 = (uv_process_t *)&uStack_7b8;
    iVar1 = uv_read_start(puVar9,on_alloc,on_read_once);
    if (iVar1 != 0) goto LAB_0016ed11;
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_7f8._4_4_;
    nread = (code *)0x1802fd;
    sVar8 = write(auStack_7f8._4_4_,"",1);
    if (sVar8 != 1) goto LAB_0016ed16;
    puVar9 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016ed1b;
    if (output_used != 1) goto LAB_0016ed20;
    uv_close(&uStack_7b8,close_cb);
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_7f8._4_4_;
    nread = (code *)0x1802fd;
    sVar8 = write(auStack_7f8._4_4_,"",1);
    if (sVar8 != 1) goto LAB_0016ed25;
    puVar9 = (uv_process_t *)uv_default_loop();
    puVar11 = &timer;
    iVar1 = uv_timer_init();
    nread = (code *)puVar11;
    if (iVar1 != 0) goto LAB_0016ed2a;
    puVar11 = &timer;
    nread = timer_counter_cb;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    puVar9 = (uv_process_t *)puVar11;
    if (iVar1 != 0) goto LAB_0016ed2f;
    puVar9 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar1 = uv_run();
    if (iVar1 == 1) {
      puVar9 = (uv_process_t *)uv_default_loop();
      nread = (code *)0x1;
      iVar1 = uv_run();
      if (iVar1 != 0) goto LAB_0016ed48;
    }
    if (timer_counter != 1) goto LAB_0016ed34;
    puVar9 = &process;
    nread = (code *)0xf;
    iVar1 = uv_process_kill();
    if (iVar1 != 0) goto LAB_0016ed39;
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_7f8._4_4_;
    iVar1 = close(auStack_7f8._4_4_);
    if (iVar1 != 0) goto LAB_0016ed3e;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    nread = (code *)0x0;
    uv_run(uVar3);
    puVar9 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0016ed02:
    run_test_closed_fd_events_cold_2();
LAB_0016ed07:
    run_test_closed_fd_events_cold_3();
LAB_0016ed0c:
    run_test_closed_fd_events_cold_4();
LAB_0016ed11:
    run_test_closed_fd_events_cold_5();
LAB_0016ed16:
    run_test_closed_fd_events_cold_6();
LAB_0016ed1b:
    run_test_closed_fd_events_cold_7();
LAB_0016ed20:
    run_test_closed_fd_events_cold_8();
LAB_0016ed25:
    run_test_closed_fd_events_cold_9();
LAB_0016ed2a:
    run_test_closed_fd_events_cold_10();
LAB_0016ed2f:
    run_test_closed_fd_events_cold_11();
LAB_0016ed34:
    run_test_closed_fd_events_cold_13();
LAB_0016ed39:
    run_test_closed_fd_events_cold_14();
LAB_0016ed3e:
    run_test_closed_fd_events_cold_15();
  }
  run_test_closed_fd_events_cold_16();
LAB_0016ed48:
  run_test_closed_fd_events_cold_12();
  uv_read_stop();
  on_read((uv_stream_t *)puVar9,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* process, child stdin */

  MAKE_VALGRIND_HAPPY();
  return 0;
}